

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O1

DetectorResult *
ZXing::QRCode::SampleQR
          (DetectorResult *__return_storage_ptr__,BitMatrix *image,FinderPatternSet *fp)

{
  PointT<double> *pPVar1;
  double *pdVar2;
  undefined8 uVar3;
  int *piVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  PointT<double> b;
  value_t val;
  void *pvVar7;
  undefined1 auVar8 [16];
  FinderPatternSet *pFVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Version *pVVar13;
  PointI PVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  _Storage<ZXing::PointT<double>,_true> *p_Var19;
  int x_2;
  long lVar20;
  int x;
  int iVar21;
  ulong uVar22;
  DimensionEstimate *pDVar23;
  value_t *pvVar24;
  undefined8 *puVar25;
  PerspectiveTransform *pPVar26;
  pointer pRVar27;
  int y;
  int iVar28;
  uint uVar29;
  PointI PVar30;
  ulong uVar31;
  int x_1;
  uint uVar32;
  int iVar33;
  DimensionEstimate *pDVar34;
  bool bVar35;
  byte bVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  _Storage<ZXing::PointT<double>,_true> _Var43;
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  PointF PVar47;
  PointF p;
  PointF p_00;
  PointF estimate;
  PointF p_02;
  PointF PVar48;
  PointF PVar49;
  PointF p_05;
  Matrix<std::optional<ZXing::PointT<double>_>_> apP;
  ROIs rois;
  optional<ZXing::PointT<double>_> brCP;
  vector<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_> hori;
  PerspectiveTransform mod2Pix;
  RegressionLine tr3;
  RegressionLine tr2;
  RegressionLine bl3;
  RegressionLine bl2;
  DimensionEstimate left;
  DimensionEstimate top;
  undefined1 local_378 [16];
  Matrix<std::optional<ZXing::PointT<double>_>_> local_368;
  _Storage<ZXing::PointT<double>,_true> local_348;
  vector<ZXing::ROI,_std::allocator<ZXing::ROI>_> local_338;
  double local_318;
  undefined8 uStack_310;
  Version *local_308;
  double dStack_300;
  double local_2f0;
  ulong local_2e8;
  PointI local_2e0;
  undefined1 local_2d8 [64];
  bool local_298;
  FinderPatternSet *local_278;
  DetectorResult *local_270;
  QuadrilateralF local_268;
  RegressionLine local_228;
  PerspectiveTransform local_1e0;
  RegressionLine local_198;
  RegressionLine local_158;
  RegressionLine local_118;
  RegressionLine local_d8;
  PointF local_98;
  _Storage<ZXing::PointT<double>,_true> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  uint7 uStack_67;
  DimensionEstimate local_60;
  DimensionEstimate local_48;
  PointF p_01;
  PointF p_03;
  PointF p_04;
  
  bVar36 = 0;
  EstimateDimension(&local_48,image,fp->tl,fp->tr);
  EstimateDimension(&local_60,image,fp->tl,fp->bl);
  if (local_48.dim == 0 && local_60.dim == 0) {
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pDVar23 = &local_60;
  uVar16 = local_60.dim;
  if (local_60.dim < local_48.dim) {
    pDVar23 = &local_48;
    uVar16 = local_48.dim;
  }
  if (local_48.err < local_60.err) {
    local_60.dim = local_48.dim;
  }
  uVar11 = local_60.dim;
  if (local_48.err == local_60.err) {
    uVar11 = uVar16;
  }
  PVar30.y = 0;
  PVar30.x = uVar11;
  pDVar34 = &local_60;
  if (local_48.err < local_60.err) {
    pDVar34 = &local_48;
  }
  if (local_48.err == local_60.err) {
    pDVar34 = pDVar23;
  }
  local_308 = (Version *)pDVar34->ms;
  iVar33 = local_48.err;
  TraceLine(&local_d8,image,(fp->bl).super_PointF,(fp->tl).super_PointF,2);
  TraceLine(&local_118,image,(fp->bl).super_PointF,(fp->tl).super_PointF,3);
  TraceLine(&local_158,image,(fp->tr).super_PointF,(fp->tl).super_PointF,2);
  TraceLine(&local_198,image,(fp->tr).super_PointF,(fp->tl).super_PointF,3);
  dVar37 = (double)local_308 + 1.0;
  local_2f0 = (double)CONCAT44(local_2f0._4_4_,(int)dVar37);
  local_378._8_8_ = 0xbff0000000000000;
  local_378._0_8_ = 0xbff0000000000000;
  if ((((!NAN(local_d8.a)) && (!NAN(local_158.a))) && (!NAN(local_118.a))) && (!NAN(local_198.a))) {
    dVar45 = local_198.b * local_118.a - local_118.b * local_198.a;
    dVar46 = local_158.b * local_d8.a - local_d8.b * local_158.a;
    auVar42._0_8_ = local_198.b * local_118.c - local_198.c * local_118.b;
    auVar42._8_8_ = local_158.c * local_d8.a - local_158.a * local_d8.c;
    auVar39._8_8_ = dVar46;
    auVar39._0_8_ = dVar45;
    auVar42 = divpd(auVar42,auVar39);
    auVar38._0_8_ = local_158.b * local_d8.c - local_158.c * local_d8.b;
    auVar38._8_8_ = local_198.c * local_118.a - local_198.a * local_118.c;
    auVar6._8_8_ = dVar45;
    auVar6._0_8_ = dVar46;
    auVar39 = divpd(auVar38,auVar6);
    PVar47.x = (Version *)((auVar39._0_8_ + auVar42._0_8_) * 0.5);
    dStack_300 = (auVar39._8_8_ + auVar42._8_8_) * 0.5;
    local_378 = _DAT_001a2540;
    local_308 = PVar47.x;
    if (0x15 < (int)uVar11) {
      PVar47.y = dStack_300;
      LocateAlignmentPattern
                ((optional<ZXing::PointT<double>_> *)local_2d8,(QRCode *)image,
                 (BitMatrix *)(ulong)(uint)(int)dVar37,iVar33,PVar47);
      auVar41._0_4_ = (int)(local_2d8._16_4_ << 0x1f) >> 0x1f;
      auVar41._4_4_ = (int)(local_2d8._16_4_ << 0x1f) >> 0x1f;
      auVar41._8_4_ = (int)(local_2d8._16_4_ << 0x1f) >> 0x1f;
      auVar41._12_4_ = (int)(local_2d8._16_4_ << 0x1f) >> 0x1f;
      auVar8._4_4_ = local_2d8._4_4_;
      auVar8._0_4_ = local_2d8._0_4_;
      auVar8._8_4_ = local_2d8._8_4_;
      auVar8._12_4_ = local_2d8._12_4_;
      local_378 = auVar41 & auVar8 | ~auVar41 & _DAT_001a2540;
    }
    if ((((local_378._0_8_ < 0.0) || ((double)image->_width <= local_378._0_8_)) ||
        ((local_378._8_8_ < 0.0 || ((double)image->_height <= local_378._8_8_)))) &&
       ((dVar37 = EstimateTilt(fp), 1.1 < dVar37 ||
        (((bVar35 = RegressionLine::isHighRes(&local_d8), bVar35 &&
          (bVar35 = RegressionLine::isHighRes(&local_118), bVar35)) &&
         ((bVar35 = RegressionLine::isHighRes(&local_158), bVar35 &&
          (bVar35 = RegressionLine::isHighRes(&local_198), bVar35)))))))) {
      local_378._8_8_ = dStack_300;
      local_378._0_8_ = local_308;
    }
  }
  local_318 = 0.0;
  if (((((double)local_378._0_8_ < 0.0) || ((double)image->_width <= (double)local_378._0_8_)) ||
      ((double)local_378._8_8_ < 0.0)) || ((double)image->_height <= (double)local_378._8_8_)) {
    local_378._0_8_ = ((fp->tr).super_PointF.x - (fp->tl).super_PointF.x) + (fp->bl).super_PointF.x;
    local_378._8_8_ = ((fp->tr).super_PointF.y - (fp->tl).super_PointF.y) + (fp->bl).super_PointF.y;
  }
  else {
    local_318 = 3.0;
  }
  local_228._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(fp->tl).super_PointF.x;
  local_228._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(fp->tl).super_PointF.y;
  local_228._points.
  super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(fp->tr).super_PointF.x;
  local_228._directionInward.x = (fp->tr).super_PointF.y;
  local_228.b = (fp->bl).super_PointF.x;
  local_228.c = (fp->bl).super_PointF.y;
  local_2d8._16_8_ = (double)(int)uVar11 + -3.5;
  local_2d8._0_4_ = 0;
  local_2d8._4_4_ = 0x400c0000;
  local_2d8._8_4_ = 0;
  local_2d8._12_4_ = 0x400c0000;
  local_2d8._24_8_ = 3.5;
  local_2d8._48_8_ = 3.5;
  uStack_310 = 0;
  local_2d8._32_8_ = (double)local_2d8._16_8_ - local_318;
  local_2d8._40_8_ = local_2d8._32_8_;
  local_2d8._56_8_ = local_2d8._16_8_;
  local_228._directionInward.y = (double)local_378._0_8_;
  local_228.a = (value_t_conflict)local_378._8_8_;
  PerspectiveTransform::PerspectiveTransform
            (&local_1e0,(QuadrilateralF *)local_2d8,(QuadrilateralF *)&local_228);
  if ((int)uVar11 < 0x2d) {
    SampleGrid(__return_storage_ptr__,image,uVar11,uVar11,&local_1e0);
  }
  else {
    local_278 = fp;
    local_270 = __return_storage_ptr__;
    local_2d8._0_4_ = 0;
    local_2d8._4_4_ = 0;
    local_228._points.
    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT62(local_228._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._2_6_,0x100);
    local_308 = (Version *)CONCAT44(local_308._4_4_,uVar11 - 9);
    dVar37 = 0.0;
    local_2e0 = PVar30;
    do {
      local_348._M_value.x = dVar37;
      uVar31 = (ulong)*(byte *)((long)&local_228._points.
                                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + (long)dVar37);
      iVar28 = 5;
      iVar33 = 0;
      do {
        iVar21 = (int)local_308;
        do {
          iVar15 = iVar21;
          iVar10 = iVar28;
          if (uVar31 != 0) {
            iVar15 = iVar28;
            iVar10 = iVar21;
          }
          PVar48.x = (double)iVar15 + 0.5;
          PVar48.y = (double)iVar10 + 0.5;
          PVar47 = PerspectiveTransform::operator()(&local_1e0,PVar48);
          dVar45 = PVar47.y;
          dVar37 = PVar47.x;
          iVar10 = -1;
          if (((0.0 <= dVar37) && (dVar37 < (double)image->_width)) &&
             ((0.0 <= dVar45 && (dVar45 < (double)image->_height)))) {
            bVar35 = BitMatrix::get(image,(int)dVar37,(int)dVar45);
            iVar10 = (uint)bVar35 + iVar33 * 2;
          }
          iVar33 = iVar10;
          bVar35 = (int)(uVar11 - 0xb) < iVar21;
          iVar21 = iVar21 + -1;
        } while (bVar35);
        bVar35 = iVar28 != 0;
        iVar28 = iVar28 + -1;
      } while (bVar35);
      *(int *)(local_2d8 + uVar31 * 4) = iVar33;
      dVar37 = (double)(local_348._0_8_ + 1);
    } while (dVar37 != 9.88131291682493e-324);
    pVVar13 = Version::DecodeVersionInformation(local_2d8._0_4_,local_2d8._4_4_);
    __return_storage_ptr__ = local_270;
    pFVar9 = local_278;
    PVar30 = local_2e0;
    if (pVVar13 != (Version *)0x0) {
      PVar14 = Version::SymbolSize(pVVar13->_versionNumber,(pVVar13->_type == Micro) + Model2);
      uVar11 = PVar14.x - PVar30.x;
      uVar16 = -uVar11;
      if (0 < (int)uVar11) {
        uVar16 = uVar11;
      }
      if (uVar16 < 9) {
        PVar14 = Version::SymbolSize(pVVar13->_versionNumber,(pVVar13->_type == Micro) + Model2);
        if (PVar30.x != PVar14.x) {
          PVar30 = Version::SymbolSize(pVVar13->_versionNumber,(pVVar13->_type == Micro) + Model2);
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x =
               (pFVar9->tl).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
               (pFVar9->tl).super_PointF.y;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (pFVar9->tr).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y =
               (pFVar9->tr).super_PointF.y;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (pFVar9->bl).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (pFVar9->bl).super_PointF.y;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)PVar30.x + -3.5);
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_228._directionInward.x = 3.5;
          local_228.b = 3.5;
          local_228._directionInward.y =
               (double)local_228._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - local_318;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = (double)local_378._0_8_;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = (double)local_378._8_8_;
          local_228.a = local_228._directionInward.y;
          local_228.c = (value_t_conflict)
                        local_228._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)local_2d8,(QuadrilateralF *)&local_228,&local_268);
          pvVar24 = (value_t *)local_2d8;
          pPVar26 = &local_1e0;
          for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
            pPVar26->a11 = *pvVar24;
            pvVar24 = pvVar24 + (ulong)bVar36 * -2 + 1;
            pPVar26 = (PerspectiveTransform *)((long)pPVar26 + ((ulong)bVar36 * -2 + 1) * 8);
          }
        }
        local_68 = 0;
        iVar33 = (int)((ulong)((long)(pVVar13->_alignmentPatternCenters).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(pVVar13->_alignmentPatternCenters).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.y =
             (double)uStack_70;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value.x =
             (double)local_78;
        val.super__Optional_base<ZXing::PointT<double>,_true,_true>._M_payload.
        super__Optional_payload_base<ZXing::PointT<double>_>._16_8_ = (ulong)uStack_67 << 8;
        Matrix<std::optional<ZXing::PointT<double>_>_>::Matrix(&local_368,iVar33,iVar33,val);
        piVar4 = (pVVar13->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        piVar5 = (pVVar13->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        PVar49.x = (double)*piVar4 + 0.5;
        PVar49.y = PVar49.x;
        local_308 = pVVar13;
        PVar47 = PerspectiveTransform::operator()(&local_1e0,PVar49);
        local_318 = PVar47.y;
        *(PointF *)
         local_368._data.
         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = PVar47;
        *(undefined1 *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 0x10) = 1;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2d8,image,
                   (pFVar9->tl).super_PointF,(pFVar9->tl).size,2);
        uVar16 = (uint)((ulong)((long)piVar5 - (long)piVar4) >> 2);
        local_2e8 = (ulong)(uVar16 - 1);
        if (local_298 == true) {
          lVar18 = 0;
          dVar37 = local_318;
          do {
            _Var43 = (_Storage<ZXing::PointT<double>,_true>)
                     *(_Storage<ZXing::PointT<double>,_true> *)
                      &((_Storage<ZXing::PointT<double>,_true> *)(local_2d8 + lVar18))->_M_value;
            dVar45 = _Var43._M_value.x - PVar47.x;
            dVar46 = _Var43._M_value.y - dVar37;
            dVar45 = dVar45 * dVar45 + dVar46 * dVar46;
            if (dVar45 < 0.0) {
              local_348 = _Var43;
              dVar45 = sqrt(dVar45);
              dVar37 = local_318;
              _Var43 = local_348;
            }
            else {
              dVar45 = SQRT(dVar45);
            }
            if (dVar45 < (double)((pFVar9->tl).size / 2)) {
              *(_Storage<ZXing::PointT<double>,_true> *)
               local_368._data.
               super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start = (PointT<double>)_Var43;
              *(undefined1 *)
               ((long)local_368._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 0x10) = 1;
            }
            lVar18 = lVar18 + 0x10;
          } while (lVar18 != 0x40);
        }
        piVar4 = (local_308->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar20 = (long)(int)local_2e8;
        p.x = (double)*piVar4 + 0.5;
        p.y = (double)piVar4[lVar20] + 0.5;
        PVar47 = PerspectiveTransform::operator()(&local_1e0,p);
        local_318 = PVar47.y;
        lVar18 = local_368._width * lVar20;
        *(double *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18) = PVar47.x;
        *(double *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 8) = local_318;
        *(undefined1 *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 0x10) = 1;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2d8,image,
                   (pFVar9->bl).super_PointF,(pFVar9->bl).size,2);
        if (local_298 == true) {
          lVar18 = 0;
          dVar37 = local_318;
          do {
            _Var43 = (_Storage<ZXing::PointT<double>,_true>)
                     *(_Storage<ZXing::PointT<double>,_true> *)
                      &((_Storage<ZXing::PointT<double>,_true> *)(local_2d8 + lVar18))->_M_value;
            dVar45 = _Var43._M_value.x - PVar47.x;
            dVar46 = _Var43._M_value.y - dVar37;
            dVar45 = dVar45 * dVar45 + dVar46 * dVar46;
            if (dVar45 < 0.0) {
              local_348 = _Var43;
              dVar45 = sqrt(dVar45);
              dVar37 = local_318;
              _Var43 = local_348;
            }
            else {
              dVar45 = SQRT(dVar45);
            }
            if (dVar45 < (double)((pFVar9->bl).size / 2)) {
              ((_Storage<ZXing::PointT<double>,_true> *)
              ((long)local_368._data.
                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_368._width * lVar20 * 0x18))
              ->_M_value = (PointT<double>)_Var43;
              *(undefined1 *)
               ((long)local_368._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               local_368._width * lVar20 * 0x18 + 0x10) = 1;
            }
            lVar18 = lVar18 + 0x10;
          } while (lVar18 != 0x40);
        }
        piVar4 = (local_308->_alignmentPatternCenters).super__Vector_base<int,_std::allocator<int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_00.x = (double)piVar4[lVar20] + 0.5;
        p_00.y = (double)*piVar4 + 0.5;
        PVar47 = PerspectiveTransform::operator()(&local_1e0,p_00);
        local_318 = PVar47.y;
        *(double *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar20 * 0x18) = PVar47.x;
        *(double *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar20 * 0x18 + 8) = local_318;
        *(undefined1 *)
         ((long)local_368._data.
                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar20 * 0x18 + 0x10) = 1;
        FindConcentricPatternCorners
                  ((optional<ZXing::Quadrilateral<ZXing::PointT<double>_>_> *)local_2d8,image,
                   (pFVar9->tr).super_PointF,(pFVar9->tr).size,2);
        if (local_298 == true) {
          lVar18 = 0;
          dVar37 = local_318;
          do {
            _Var43 = (_Storage<ZXing::PointT<double>,_true>)
                     *(_Storage<ZXing::PointT<double>,_true> *)
                      &((_Storage<ZXing::PointT<double>,_true> *)(local_2d8 + lVar18))->_M_value;
            dVar45 = _Var43._M_value.x - PVar47.x;
            dVar46 = _Var43._M_value.y - dVar37;
            dVar45 = dVar45 * dVar45 + dVar46 * dVar46;
            if (dVar45 < 0.0) {
              local_348 = _Var43;
              dVar45 = sqrt(dVar45);
              dVar37 = local_318;
              _Var43 = local_348;
            }
            else {
              dVar45 = SQRT(dVar45);
            }
            if (dVar45 < (double)((pFVar9->tr).size / 2)) {
              ((_Storage<ZXing::PointT<double>,_true> *)
              ((long)local_368._data.
                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar20 * 0x18))->_M_value =
                   (PointT<double>)_Var43;
              *(undefined1 *)
               ((long)local_368._data.
                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar20 * 0x18 + 0x10) = 1;
            }
            lVar18 = lVar18 + 0x10;
          } while (lVar18 != 0x40);
        }
        local_2e0 = PVar30;
        if (0 < (int)uVar16) {
          local_348._M_value.x = -NAN;
          local_318 = 0.0;
          uVar31 = 0;
          do {
            lVar20 = 0x10;
            lVar18 = 0;
            uVar22 = 0;
            do {
              if (*(char *)((long)local_368._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (uVar31 * (long)local_368._width + uVar22) * 0x18 + 0x10) == '\0') {
                if (lVar18 == 0) {
                  piVar5 = (local_308->_alignmentPatternCenters).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  p_01.x = (double)piVar5[uVar22] + 0.5;
                  p_01.y = (double)piVar5[uVar31] + 0.5;
                  p_Var19 = (_Storage<ZXing::PointT<double>,_true> *)
                            local_368._data.
                            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  estimate = PerspectiveTransform::operator()(&local_1e0,p_01);
                  iVar33 = (int)p_Var19;
                }
                else {
                  p_Var19 = (_Storage<ZXing::PointT<double>,_true> *)
                            ((long)local_368._data.
                                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            (long)local_368._width * (long)local_318);
                  if ((*(byte *)(lVar20 + -0x18 + (long)p_Var19) & 1) == 0) {
                    piVar5 = (local_308->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_02.x = (double)piVar5[uVar22 - 1] + 0.5;
                    p_02.y = (double)piVar5[uVar31] + 0.5;
                    PVar47 = PerspectiveTransform::operator()(&local_1e0,p_02);
                  }
                  else {
                    PVar47 = *(PointF *)(lVar20 + -0x28 + (long)p_Var19);
                  }
                  iVar33 = (int)p_Var19;
                  if ((*(byte *)((long)local_368._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar20 + (long)local_368._width * local_348._0_8_) & 1) == 0) {
                    piVar5 = (local_308->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_03.x = (double)piVar5[uVar22] + 0.5;
                    p_03.y = (double)piVar5[uVar31 - 1] + 0.5;
                    PVar48 = PerspectiveTransform::operator()(&local_1e0,p_03);
                  }
                  else {
                    PVar48 = *(PointF *)
                              ((long)local_368._data.
                                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              lVar20 + -0x10 + (long)local_368._width * local_348._0_8_);
                  }
                  if ((*(byte *)((long)local_368._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar20 + -0x18 + (long)local_368._width * local_348._0_8_) & 1) == 0
                     ) {
                    piVar5 = (local_308->_alignmentPatternCenters).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    p_04.x = (double)piVar5[uVar22 - 1] + 0.5;
                    p_04.y = (double)piVar5[uVar31 - 1] + 0.5;
                    local_98 = PVar48;
                    PVar49 = PerspectiveTransform::operator()(&local_1e0,p_04);
                    PVar48 = local_98;
                  }
                  else {
                    PVar49 = *(PointF *)
                              ((long)local_368._data.
                                     super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                              lVar20 + -0x28 + (long)local_368._width * local_348._0_8_);
                  }
                  estimate.y = (PVar47.y + PVar48.y) - PVar49.y;
                  estimate.x = (PVar47.x + PVar48.x) - PVar49.x;
                }
                LocateAlignmentPattern
                          ((optional<ZXing::PointT<double>_> *)local_2d8,(QRCode *)image,
                           (BitMatrix *)((ulong)local_2f0 & 0xffffffff),iVar33,estimate);
                if ((bool)local_2d8[0x10] == true) {
                  puVar25 = (undefined8 *)
                            ((long)local_368._data.
                                   super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                            lVar20 + -0x10 + (long)local_368._width * (long)local_318);
                  *puVar25 = CONCAT44(local_2d8._4_4_,local_2d8._0_4_);
                  puVar25[1] = CONCAT44(local_2d8._12_4_,local_2d8._8_4_);
                  *(undefined1 *)
                   ((long)local_368._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   lVar20 + (long)local_368._width * (long)local_318) = 1;
                }
              }
              uVar22 = uVar22 + 1;
              lVar20 = lVar20 + 0x18;
              lVar18 = lVar18 + uVar31;
            } while ((uVar16 & 0x7fffffff) != uVar22);
            uVar31 = uVar31 + 1;
            local_318 = (double)((long)local_318 + 0x18);
            local_348._M_value.x = (double)(local_348._0_8_ + 0x18);
          } while (uVar31 != (uVar16 & 0x7fffffff));
        }
        if (0 < (int)uVar16) {
          uVar12 = (int)local_2e8 * 2 + 2;
          uVar11 = 3;
          if (3 < (int)uVar12) {
            uVar11 = uVar12;
          }
          uVar12 = 0;
          do {
            uVar32 = 0;
            do {
              if (*(char *)((long)local_368._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (long)(int)(local_368._width * uVar12 + uVar32) * 0x18 + 0x10) == '\0') {
                local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = 0.0;
                local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = 0.0;
                local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = 0.0;
                local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (ROI *)0x0;
                local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                super__Vector_impl_data._M_finish = (ROI *)0x0;
                if (uVar16 != 1) {
                  uVar31 = 2;
                  do {
                    if (1 < (int)((ulong)((long)local_268.super_array<ZXing::PointT<double>,_4UL>.
                                                _M_elems[0].y -
                                         (long)local_268.super_array<ZXing::PointT<double>,_4UL>.
                                               _M_elems[0].x) >> 4)) break;
                    iVar33 = (int)(uVar31 >> 1);
                    iVar28 = -iVar33;
                    if ((uVar31 & 1) != 0) {
                      iVar28 = iVar33;
                    }
                    if ((iVar28 + uVar32 < uVar16) &&
                       (lVar18 = (long)(int)(local_368._width * uVar12 + iVar28 + uVar32),
                       *(char *)((long)local_368._data.
                                       super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                lVar18 * 0x18 + 0x10) == '\x01')) {
                      pPVar1 = (PointT<double> *)
                               ((long)local_368._data.
                                      super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18);
                      if (local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y ==
                          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x) {
                        std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>::
                        _M_realloc_insert<ZXing::PointT<double>const&>
                                  ((vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>
                                    *)&local_268,
                                   (iterator)
                                   local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y,
                                   pPVar1);
                      }
                      else {
                        dVar37 = pPVar1->y;
                        *(double *)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
                             pPVar1->x;
                        *(double *)
                         ((long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y + 8)
                             = dVar37;
                        local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
                             (double)((long)local_268.super_array<ZXing::PointT<double>,_4UL>.
                                            _M_elems[0].y + 0x10);
                      }
                    }
                    uVar29 = (int)uVar31 + 1;
                    uVar31 = (ulong)uVar29;
                  } while (uVar11 != uVar29);
                  if (uVar16 != 1) {
                    uVar31 = 2;
                    do {
                      if (1 < (int)((ulong)((long)local_338.
                                                  super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_338.
                                                 super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4))
                      break;
                      iVar33 = (int)(uVar31 >> 1);
                      iVar28 = -iVar33;
                      if ((uVar31 & 1) != 0) {
                        iVar28 = iVar33;
                      }
                      if ((iVar28 + uVar12 < uVar16) &&
                         (lVar18 = (long)(int)((iVar28 + uVar12) * local_368._width + uVar32),
                         *(char *)((long)local_368._data.
                                         super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                  lVar18 * 0x18 + 0x10) == '\x01')) {
                        pPVar1 = (PointT<double> *)
                                 ((long)local_368._data.
                                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18);
                        if (local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                          std::vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>::
                          _M_realloc_insert<ZXing::PointT<double>const&>
                                    ((vector<ZXing::PointT<double>,std::allocator<ZXing::PointT<double>>>
                                      *)&local_338,
                                     (iterator)
                                     local_338.
                                     super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,pPVar1);
                        }
                        else {
                          dVar37 = pPVar1->y;
                          *(double *)
                           &(local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->x0 = pPVar1->x;
                          *(double *)
                           &(local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                             _M_impl.super__Vector_impl_data._M_finish)->y0 = dVar37;
                          local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_finish =
                               (pointer)((long)local_338.
                                               super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>
                                               ._M_impl.super__Vector_impl_data._M_finish + 0x10);
                        }
                      }
                      uVar29 = (int)uVar31 + 1;
                      uVar31 = (ulong)uVar29;
                    } while (uVar11 != uVar29);
                  }
                }
                if ((((long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y -
                      (long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x &
                     0xffffffff0U) == 0x20) &&
                   (uVar31 = (long)local_338.
                                   super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_338.
                                   super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                   _M_impl.super__Vector_impl_data._M_start & 0xffffffff0,
                   uVar31 == 0x20)) {
                  RegressionLine::RegressionLine<double>
                            ((RegressionLine *)local_2d8,
                             *(PointT<double> *)
                              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x,
                             *(PointT<double> *)
                              ((long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x
                              + 0x10));
                  iVar33 = (int)uVar31;
                  b.x = ((local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a11;
                  b.y = ((local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_start)->mod2Pix).a12;
                  RegressionLine::RegressionLine<double>
                            (&local_228,
                             *(PointT<double> *)
                              local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                              _M_impl.super__Vector_impl_data._M_start,b);
                  auVar40._0_8_ =
                       (double)local_2d8._40_8_ * local_228.b +
                       -(double)local_2d8._48_8_ * local_228.a;
                  auVar44._0_8_ =
                       (double)local_2d8._56_8_ * local_228.b -
                       local_228.c * (double)local_2d8._48_8_;
                  auVar44._8_8_ =
                       (double)local_2d8._40_8_ * local_228.c -
                       local_228.a * (double)local_2d8._56_8_;
                  auVar40._8_8_ = auVar40._0_8_;
                  local_348 = (_Storage<ZXing::PointT<double>,_true>)divpd(auVar44,auVar40);
                  local_88 = local_348;
                  if (local_228._points.
                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_228._points.
                                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_228._points.
                                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_228._points.
                                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  pvVar7 = (void *)CONCAT44(local_2d8._4_4_,local_2d8._0_4_);
                  if (pvVar7 != (void *)0x0) {
                    operator_delete(pvVar7,local_2d8._16_8_ - (long)pvVar7);
                  }
                  LocateAlignmentPattern
                            ((optional<ZXing::PointT<double>_> *)
                             &((_Storage<ZXing::PointT<double>,_true> *)local_2d8)->_M_value,
                             (QRCode *)image,(BitMatrix *)((ulong)local_2f0 & 0xffffffff),iVar33,
                             local_348._M_value);
                  p_Var19 = &local_88;
                  if ((bool)local_2d8[0x10] != false) {
                    p_Var19 = (_Storage<ZXing::PointT<double>,_true> *)local_2d8;
                  }
                  lVar18 = (long)(int)(local_368._width * uVar12 + uVar32);
                  dVar37 = (p_Var19->_M_value).y;
                  pdVar2 = (double *)
                           ((long)local_368._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18);
                  *pdVar2 = (((_Optional_base<ZXing::PointT<double>,_true,_true> *)
                             &(p_Var19->_M_value).x)->_M_payload).
                            super__Optional_payload_base<ZXing::PointT<double>_>._M_payload._M_value
                            .x;
                  pdVar2[1] = dVar37;
                  *(undefined1 *)
                   ((long)local_368._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 0x10) = 1;
                }
                if (local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_338.
                                  super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_338.
                                        super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_338.
                                        super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
                }
                if ((PointT<double> *)
                    local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x !=
                    (PointT<double> *)0x0) {
                  operator_delete((void *)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                          [0].x,
                                  (long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                        [1].x -
                                  (long)local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems
                                        [0].x);
                }
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar16);
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar16);
        }
        lVar18 = (long)((local_368._width + 1) * (int)local_2e8);
        if ((*(byte *)((long)local_368._data.
                             super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 0x10) & 1)
            != 0) {
          pdVar2 = (double *)
                   ((long)local_368._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18);
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = *pdVar2;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = pdVar2[1];
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x =
               (local_278->tl).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y =
               (local_278->tl).super_PointF.y;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x =
               (local_278->tr).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y =
               (local_278->tr).super_PointF.y;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x =
               (local_278->bl).super_PointF.x;
          local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y =
               (local_278->bl).super_PointF.y;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)((double)local_2e0.x + -3.5);
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x400c000000000000;
          local_228._points.
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x400c000000000000;
          local_228._directionInward.x = 3.5;
          local_228.b = 3.5;
          local_228._directionInward.y =
               (double)local_228._points.
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + -3.0;
          local_228.a = local_228._directionInward.y;
          local_228.c = (value_t_conflict)
                        local_228._points.
                        super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          PerspectiveTransform::PerspectiveTransform
                    ((PerspectiveTransform *)local_2d8,(QuadrilateralF *)&local_228,&local_268);
          pvVar24 = (value_t *)local_2d8;
          pPVar26 = &local_1e0;
          for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
            pPVar26->a11 = *pvVar24;
            pvVar24 = pvVar24 + (ulong)bVar36 * -2 + 1;
            pPVar26 = (PerspectiveTransform *)((long)pPVar26 + ((ulong)bVar36 * -2 + 1) * 8);
          }
        }
        if (0 < (int)uVar16) {
          uVar31 = 0;
          do {
            uVar22 = 0;
            do {
              if (*(char *)((long)local_368._data.
                                  super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                           (long)(local_368._width * (int)uVar31 + (int)uVar22) * 0x18 + 0x10) ==
                  '\0') {
                piVar5 = (local_308->_alignmentPatternCenters).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                p_05.x = (double)piVar5[uVar22] + 0.5;
                p_05.y = (double)piVar5[uVar31] + 0.5;
                PVar47 = PerspectiveTransform::operator()(&local_1e0,p_05);
                lVar18 = (long)(local_368._width * (int)uVar31 + (int)uVar22);
                *(double *)
                 ((long)local_368._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18) = PVar47.x;
                *(double *)
                 ((long)local_368._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 8) = PVar47.y;
                *(undefined1 *)
                 ((long)local_368._data.
                        super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar18 * 0x18 + 0x10) = 1;
              }
              uVar22 = uVar22 + 1;
            } while ((uVar16 & 0x7fffffff) != uVar22);
            uVar31 = uVar31 + 1;
          } while (uVar31 != (uVar16 & 0x7fffffff));
        }
        pVVar13 = local_308;
        _Var43 = local_348;
        local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_finish = (ROI *)0x0;
        local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (ROI *)0x0;
        if (1 < (int)uVar16) {
          local_348._4_4_ = 0;
          local_348._0_4_ = uVar16 - 2;
          local_348._8_8_ = _Var43._M_value.y;
          local_2f0 = (double)(local_2e8 & 0xffffffff);
          iVar33 = 1;
          dVar37 = 0.0;
          do {
            iVar28 = 0;
            if (dVar37 == 0.0) {
              iVar28 = -6;
            }
            iVar21 = 0;
            if (dVar37 == (double)local_348._0_8_) {
              iVar21 = 7;
            }
            dVar45 = 0.0;
            do {
              piVar5 = (pVVar13->_alignmentPatternCenters).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              iVar10 = piVar5[(long)dVar45];
              iVar15 = piVar5[(long)dVar45 + 1];
              local_2d8._0_4_ = iVar10 + -6;
              if (dVar45 != 0.0) {
                local_2d8._0_4_ = iVar10;
              }
              local_2d8._4_4_ = iVar15 + 7;
              if ((double)local_348._0_8_ != dVar45) {
                local_2d8._4_4_ = iVar15;
              }
              local_2d8._8_4_ = piVar5[(long)dVar37] + iVar28;
              local_2d8._12_4_ = piVar5[(long)dVar37 + 1] + iVar21;
              local_228._points.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)((double)iVar10 + 0.5);
              local_228._points.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((double)piVar5[(long)dVar37] + 0.5);
              local_228._points.
              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((double)iVar15 + 0.5);
              local_228.a = (double)piVar5[(long)dVar37 + 1] + 0.5;
              iVar17 = SUB84(dVar37,0) * local_368._width;
              iVar10 = SUB84(dVar45,0);
              iVar15 = local_368._width * iVar33 + iVar10;
              puVar25 = (undefined8 *)
                        ((long)local_368._data.
                               super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start +
                        (long)(iVar10 + iVar17) * 0x18);
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].x = (double)*puVar25;
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[0].y = (double)puVar25[1];
              pdVar2 = (double *)
                       ((long)local_368._data.
                              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                       (long)(iVar17 + iVar10 + 1) * 0x18);
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].x = *pdVar2;
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[1].y = pdVar2[1];
              pdVar2 = (double *)
                       ((long)local_368._data.
                              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)(iVar15 + 1) * 0x18)
              ;
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].x = *pdVar2;
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[2].y = pdVar2[1];
              pdVar2 = (double *)
                       ((long)local_368._data.
                              super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)iVar15 * 0x18);
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].x = *pdVar2;
              local_268.super_array<ZXing::PointT<double>,_4UL>._M_elems[3].y = pdVar2[1];
              local_228._directionInward.x =
                   (double)local_228._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
              local_228._directionInward.y =
                   (double)local_228._points.
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_228.b = (value_t_conflict)
                            local_228._points.
                            super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              local_228.c = local_228.a;
              PerspectiveTransform::PerspectiveTransform
                        ((PerspectiveTransform *)(local_2d8 + 0x10),(QuadrilateralF *)&local_228,
                         &local_268);
              if (local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ZXing::ROI,_std::allocator<ZXing::ROI>_>::_M_realloc_insert<ZXing::ROI>
                          (&local_338,
                           (iterator)
                           local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(ROI *)local_2d8);
              }
              else {
                puVar25 = (undefined8 *)local_2d8;
                pRVar27 = local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
                  uVar3 = *puVar25;
                  pRVar27->x0 = (int)uVar3;
                  pRVar27->x1 = (int)((ulong)uVar3 >> 0x20);
                  puVar25 = puVar25 + (ulong)bVar36 * -2 + 1;
                  pRVar27 = (ROI *)((long)pRVar27 + (ulong)bVar36 * -0x10 + 8);
                }
                local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              dVar45 = (double)((long)dVar45 + 1);
            } while (local_2f0 != dVar45);
            dVar37 = (double)((long)dVar37 + 1);
            iVar33 = iVar33 + 1;
          } while (dVar37 != local_2f0);
        }
        __return_storage_ptr__ = local_270;
        SampleGrid(local_270,image,local_2e0.x,local_2e0.x,&local_338);
        if (local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_338.super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_338.
                                super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_338.
                                super__Vector_base<ZXing::ROI,_std::allocator<ZXing::ROI>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((_Storage<ZXing::PointT<double>,_true> *)
            local_368._data.
            super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (_Storage<ZXing::PointT<double>,_true> *)0x0) {
          operator_delete(local_368._data.
                          super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_368._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_368._data.
                                super__Vector_base<std::optional<ZXing::PointT<double>_>,_std::allocator<std::optional<ZXing::PointT<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_001865c7;
      }
    }
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[2].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[3].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[0].y = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].x = 0;
    (__return_storage_ptr__->_position).super_array<ZXing::PointT<int>,_4UL>._M_elems[1].y = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->_bits)._width = 0;
    (__return_storage_ptr__->_bits)._height = 0;
    (__return_storage_ptr__->_bits)._bits.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
LAB_001865c7:
  if (local_198._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8._points.
      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8._points.
                    super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8._points.
                          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DetectorResult SampleQR(const BitMatrix& image, const FinderPatternSet& fp)
{
	auto top  = EstimateDimension(image, fp.tl, fp.tr);
	auto left = EstimateDimension(image, fp.tl, fp.bl);

	if (!top.dim && !left.dim)
		return {};

	auto best = top.err == left.err ? (top.dim > left.dim ? top : left) : (top.err < left.err ? top : left);
	int dimension = best.dim;
	int moduleSize = static_cast<int>(best.ms + 1);

	auto br = PointF{-1, -1};
	auto brOffset = PointF{3, 3};

	// Everything except version 1 (21 modules) has an alignment pattern. Estimate the center of that by intersecting
	// line extensions of the 1 module wide square around the finder patterns. This could also help with detecting
	// slanted symbols of version 1.

	// generate 4 lines: outer and inner edge of the 1 module wide black line between the two outer and the inner
	// (tl) finder pattern
	auto bl2 = TraceLine(image, fp.bl, fp.tl, 2);
	auto bl3 = TraceLine(image, fp.bl, fp.tl, 3);
	auto tr2 = TraceLine(image, fp.tr, fp.tl, 2);
	auto tr3 = TraceLine(image, fp.tr, fp.tl, 3);

	if (bl2.isValid() && tr2.isValid() && bl3.isValid() && tr3.isValid()) {
		// intersect both outer and inner line pairs and take the center point between the two intersection points
		auto brInter = (intersect(bl2, tr2) + intersect(bl3, tr3)) / 2;
		log(brInter, 3);

		if (dimension > 21)
			if (auto brCP = LocateAlignmentPattern(image, moduleSize, brInter))
				br = *brCP;

		// if the symbol is tilted or the resolution of the RegressionLines is sufficient, use their intersection
		// as the best estimate (see discussion in #199 and test image estimate-tilt.jpg )
		if (!image.isIn(br) && (EstimateTilt(fp) > 1.1 || (bl2.isHighRes() && bl3.isHighRes() && tr2.isHighRes() && tr3.isHighRes())))
			br = brInter;
	}

	// otherwise the simple estimation used by upstream is used as a best guess fallback
	if (!image.isIn(br)) {
		br = fp.tr - fp.tl + fp.bl;
		brOffset = PointF(0, 0);
	}

	log(br, 3);
	auto mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});

	if( dimension >= Version::SymbolSize(7, Type::Model2).x) {
		auto version = ReadVersion(image, dimension, mod2Pix);

		// if the version bits are garbage -> discard the detection
		if (!version || std::abs(version->dimension() - dimension) > 8)
			return DetectorResult();
		if (version->dimension() != dimension) {
			printf("update dimension: %d -> %d\n", dimension, version->dimension());
			dimension = version->dimension();
			mod2Pix = Mod2Pix(dimension, brOffset, {fp.tl, fp.tr, br, fp.bl});
		}
#if 1
		auto& apM = version->alignmentPatternCenters(); // alignment pattern positions in modules
		auto apP = Matrix<std::optional<PointF>>(Size(apM), Size(apM)); // found/guessed alignment pattern positions in pixels
		const int N = Size(apM) - 1;

		// project the alignment pattern at module coordinates x/y to pixel coordinate based on current mod2Pix
		auto projectM2P = [&mod2Pix, &apM](int x, int y) { return mod2Pix(centered(PointI(apM[x], apM[y]))); };

		auto findInnerCornerOfConcentricPattern = [&image, &apP, &projectM2P](int x, int y, const ConcentricPattern& fp) {
			auto pc = *apP.set(x, y, projectM2P(x, y));
			if (auto fpQuad = FindConcentricPatternCorners(image, fp, fp.size, 2))
				for (auto c : *fpQuad)
					if (distance(c, pc) < fp.size / 2)
						apP.set(x, y, c);
		};

		findInnerCornerOfConcentricPattern(0, 0, fp.tl);
		findInnerCornerOfConcentricPattern(0, N, fp.bl);
		findInnerCornerOfConcentricPattern(N, 0, fp.tr);

		auto bestGuessAPP = [&](int x, int y){
			if (auto p = apP(x, y))
				return *p;
			return projectM2P(x, y);
		};

		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				PointF guessed =
					x * y == 0 ? bestGuessAPP(x, y) : bestGuessAPP(x - 1, y) + bestGuessAPP(x, y - 1) - bestGuessAPP(x - 1, y - 1);
				if (auto found = LocateAlignmentPattern(image, moduleSize, guessed))
					apP.set(x, y, *found);
			}

		// go over the whole set of alignment patters again and try to fill any remaining gap by using available neighbors as guides
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				// find the two closest valid alignment pattern pixel positions both horizontally and vertically
				std::vector<PointF> hori, verti;
				for (int i = 2; i < 2 * N + 2 && Size(hori) < 2; ++i) {
					int xi = x + i / 2 * (i%2 ? 1 : -1);
					if (0 <= xi && xi <= N && apP(xi, y))
						hori.push_back(*apP(xi, y));
				}
				for (int i = 2; i < 2 * N + 2 && Size(verti) < 2; ++i) {
					int yi = y + i / 2 * (i%2 ? 1 : -1);
					if (0 <= yi && yi <= N && apP(x, yi))
						verti.push_back(*apP(x, yi));
				}

				// if we found 2 each, intersect the two lines that are formed by connecting the point pairs
				if (Size(hori) == 2 && Size(verti) == 2) {
					auto guessed = intersect(RegressionLine(hori[0], hori[1]), RegressionLine(verti[0], verti[1]));
					auto found = LocateAlignmentPattern(image, moduleSize, guessed);
					// search again near that intersection and if the search fails, use the intersection
					if (!found) printf("location guessed at %dx%d\n", x, y);
					apP.set(x, y, found ? *found : guessed);
				}
			}

		if (auto c = apP.get(N, N))
			mod2Pix = Mod2Pix(dimension, PointF(3, 3), {fp.tl, fp.tr, *c, fp.bl});

		// go over the whole set of alignment patters again and fill any remaining gaps by a projection based on an updated mod2Pix
		// projection. This works if the symbol is flat, wich is a reasonable fall-back assumption.
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x) {
				if (apP(x, y))
					continue;

				printf("locate failed at %dx%d\n", x, y);
				apP.set(x, y, projectM2P(x, y));
			}

#ifdef PRINT_DEBUG
		for (int y = 0; y <= N; ++y)
			for (int x = 0; x <= N; ++x)
				log(*apP(x, y), 2);
#endif

		// assemble a list of region-of-interests based on the found alignment pattern pixel positions
		ROIs rois;
		for (int y = 0; y < N; ++y)
			for (int x = 0; x < N; ++x) {
				int x0 = apM[x], x1 = apM[x + 1], y0 = apM[y], y1 = apM[y + 1];
				rois.push_back({x0 - (x == 0) * 6, x1 + (x == N - 1) * 7, y0 - (y == 0) * 6, y1 + (y == N - 1) * 7,
								PerspectiveTransform{Rectangle(x0, x1, y0, y1),
													 {*apP(x, y), *apP(x + 1, y), *apP(x + 1, y + 1), *apP(x, y + 1)}}});
			}

		return SampleGrid(image, dimension, dimension, rois);
#endif
	}

	return SampleGrid(image, dimension, dimension, mod2Pix);
}